

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

bool google::SendEmailInternal(char *dest,char *subject,char *body,bool use_logging)

{
  LogMessageData *pLVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong *puVar3;
  long *__s;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  istream *piVar7;
  long *plVar8;
  undefined8 *puVar9;
  FILE *__s_00;
  uint *puVar10;
  ulong *puVar11;
  int err;
  int err_00;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *this;
  long lVar12;
  element_type *peVar13;
  undefined8 uVar14;
  char *pcVar15;
  char *pcVar16;
  LogStream *pLVar17;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var18;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var19;
  byte bVar20;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string cmd;
  string logmailer;
  ostringstream sanitized_dests;
  istringstream ss;
  allocator<char> local_57a;
  allocator<char> local_579;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_578;
  ulong local_570;
  char local_568;
  undefined7 uStack_567;
  char *local_558;
  string local_550;
  char *local_530;
  long *local_528;
  long local_520;
  long local_518;
  undefined8 uStack_510;
  string local_508;
  string local_4e8;
  undefined1 *local_4c8;
  long local_4c0;
  undefined1 local_4b8;
  undefined7 uStack_4b7;
  undefined1 local_4a8 [16];
  undefined1 local_498 [80];
  undefined1 local_448 [96];
  undefined1 local_3e8 [16];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_3d0;
  string local_388;
  string local_368;
  long *local_348;
  long local_338 [2];
  undefined1 local_328 [16];
  _func_int *local_318 [12];
  ios_base local_2b8 [264];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  if ((dest != (char *)0x0) && (*dest != '\0')) {
    local_558 = body;
    local_530 = subject;
    local_328._0_8_ = local_318;
    sVar6 = strlen(dest);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_328,dest,dest + sVar6);
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)local_328,_S_in);
    if ((_func_int **)local_328._0_8_ != local_318) {
      operator_delete((void *)local_328._0_8_,(ulong)(local_318[0] + 1));
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
    local_578._M_current = &local_568;
    local_570 = 0;
    local_568 = '\0';
    this = (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_448;
    while (piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)local_1b0,(string *)&local_578,','),
          _Var19._M_current = local_578._M_current,
          ((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) {
      pcVar15 = local_578._M_current + local_570;
      _Var18._M_current = local_578._M_current;
      if (0 < (long)local_570 >> 2) {
        _Var18._M_current = local_578._M_current + (local_570 & 0xfffffffffffffffc);
        lVar12 = ((long)local_570 >> 2) + 1;
        pcVar16 = local_578._M_current + 3;
        do {
          iVar5 = isspace((int)pcVar16[-3]);
          if (iVar5 == 0) {
            pcVar16 = pcVar16 + -3;
            goto LAB_00115d6f;
          }
          iVar5 = isspace((int)pcVar16[-2]);
          if (iVar5 == 0) {
            pcVar16 = pcVar16 + -2;
            goto LAB_00115d6f;
          }
          iVar5 = isspace((int)pcVar16[-1]);
          if (iVar5 == 0) {
            pcVar16 = pcVar16 + -1;
            goto LAB_00115d6f;
          }
          iVar5 = isspace((int)*pcVar16);
          if (iVar5 == 0) goto LAB_00115d6f;
          lVar12 = lVar12 + -1;
          pcVar16 = pcVar16 + 4;
        } while (1 < lVar12);
      }
      lVar12 = (long)pcVar15 - (long)_Var18._M_current;
      if (lVar12 == 1) {
LAB_00115d4c:
        iVar5 = isspace((int)*_Var18._M_current);
        pcVar16 = _Var18._M_current;
        if (iVar5 != 0) {
          pcVar16 = pcVar15;
        }
      }
      else if (lVar12 == 2) {
LAB_00115d3c:
        iVar5 = isspace((int)*_Var18._M_current);
        pcVar16 = _Var18._M_current;
        if (iVar5 != 0) {
          _Var18._M_current = _Var18._M_current + 1;
          goto LAB_00115d4c;
        }
      }
      else {
        pcVar16 = pcVar15;
        if ((lVar12 == 3) &&
           (iVar5 = isspace((int)*_Var18._M_current), pcVar16 = _Var18._M_current, iVar5 != 0)) {
          _Var18._M_current = _Var18._M_current + 1;
          goto LAB_00115d3c;
        }
      }
LAB_00115d6f:
      if (pcVar15 == pcVar16) {
        local_570 = 0;
        *_Var19._M_current = '\0';
      }
      else {
        std::__cxx11::string::_M_erase((ulong)&local_578,0);
      }
      _Var18._M_current = local_578._M_current;
      _Var19._M_current = local_578._M_current + local_570;
      lVar12 = (long)local_570 >> 2;
      pcVar15 = _Var19._M_current;
      if (0 < lVar12) {
        pcVar15 = _Var19._M_current + lVar12 * -4;
        lVar12 = lVar12 + 1;
        do {
          iVar5 = isspace((int)_Var19._M_current[-1]);
          if (iVar5 == 0) goto LAB_00115e6b;
          iVar5 = isspace((int)_Var19._M_current[-2]);
          if (iVar5 == 0) {
            _Var19._M_current = _Var19._M_current + -1;
            goto LAB_00115e6b;
          }
          iVar5 = isspace((int)_Var19._M_current[-3]);
          if (iVar5 == 0) {
            _Var19._M_current = _Var19._M_current + -2;
            goto LAB_00115e6b;
          }
          iVar5 = isspace((int)_Var19._M_current[-4]);
          if (iVar5 == 0) {
            _Var19._M_current = _Var19._M_current + -3;
            goto LAB_00115e6b;
          }
          _Var19._M_current = _Var19._M_current + -4;
          lVar12 = lVar12 + -1;
        } while (1 < lVar12);
      }
      lVar12 = (long)pcVar15 - (long)_Var18._M_current;
      if (lVar12 == 1) {
LAB_00115e47:
        iVar5 = isspace((int)pcVar15[-1]);
        _Var19._M_current = pcVar15;
        if (iVar5 != 0) {
          _Var19._M_current = _Var18._M_current;
        }
      }
      else if (lVar12 == 2) {
LAB_00115e36:
        iVar5 = isspace((int)pcVar15[-1]);
        _Var19._M_current = pcVar15;
        if (iVar5 != 0) {
          pcVar15 = pcVar15 + -1;
          goto LAB_00115e47;
        }
      }
      else {
        _Var19._M_current = _Var18._M_current;
        if ((lVar12 == 3) &&
           (iVar5 = isspace((int)pcVar15[-1]), _Var19._M_current = pcVar15, iVar5 != 0)) {
          pcVar15 = pcVar15 + -1;
          goto LAB_00115e36;
        }
      }
LAB_00115e6b:
      local_570 = (long)_Var19._M_current - (long)_Var18._M_current;
      *_Var19._M_current = '\0';
      if (local_570 != 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (this,
                   "^[a-zA-Z0-9][a-zA-Z0-9.!#$%&\'*+/=?^_`{|}~-]*@[a-zA-Z0-9](?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?(?:\\.[a-zA-Z0-9](?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?)*$"
                   ,0x10);
        local_3d8._M_current = (char *)0x0;
        _Stack_3d0._M_current = (char *)0x0;
        local_3e8._0_8_ = (LogMessageData *)0x0;
        local_3e8._8_8_ = (LogMessageData *)0x0;
        bVar4 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (local_578,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(local_578._M_current + local_570),
                           (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_3e8,this,0);
        if ((LogMessageData *)local_3e8._0_8_ != (LogMessageData *)0x0) {
          operator_delete((void *)local_3e8._0_8_,(long)local_3d8._M_current - local_3e8._0_8_);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(this);
        if (!bVar4) {
          if (use_logging) {
            if (SendEmailInternal::vlocal__.level == (int32 *)0x0) {
              bVar4 = InitVLOG3__(&SendEmailInternal::vlocal__,&fLI::FLAGS_v,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                                  ,1);
            }
            else {
              bVar4 = 0 < *SendEmailInternal::vlocal__.level;
            }
            if (bVar4 != false) {
              LogMessage::LogMessage
                        ((LogMessage *)local_3e8,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                         ,0x88e);
              pLVar17 = (LogStream *)(local_3e8._8_8_ + 0x7538);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pLVar17,"Invalid destination email address:",0x22);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pLVar17,local_578._M_current,local_570);
              if (bVar4 != false) {
                LogMessage::~LogMessage((LogMessage *)local_3e8);
              }
            }
          }
          else {
            SendEmailInternal();
          }
          bVar4 = false;
          bVar20 = 0;
          goto LAB_0011686b;
        }
        std::__cxx11::stringbuf::str();
        uVar14 = local_3e8._8_8_;
        if ((LogMessageData *)local_3e8._0_8_ != (LogMessageData *)&local_3d8) {
          operator_delete((void *)local_3e8._0_8_,(ulong)(local_3d8._M_current + 1));
        }
        if ((LogMessageData *)uVar14 != (LogMessageData *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,",",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_328,local_578._M_current,local_570);
      }
    }
    std::__cxx11::stringbuf::str();
    __s = local_348;
    pcVar15 = local_530;
    if (use_logging) {
      if (SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level ==
          (int32 *)0x0) {
        bVar4 = InitVLOG3__(&SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__,
                            &fLI::FLAGS_v,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                            ,1);
      }
      else {
        bVar4 = 0 < *SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level;
      }
      this = (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(ulong)bVar4;
      if (bVar4 != false) {
        LogMessage::LogMessage
                  ((LogMessage *)local_3e8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                   ,0x89e);
        pLVar17 = (LogStream *)(local_3e8._8_8_ + 0x7538);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pLVar17,"Trying to send TITLE:",0x15);
        pcVar15 = local_530;
        iVar5 = (int)pLVar17;
        if (local_530 == (char *)0x0) {
          std::ios::clear(iVar5 + (int)(pLVar17->super_ostream)._vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(local_530);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pLVar17,pcVar15,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pLVar17," BODY:",6);
        pcVar15 = local_558;
        if (local_558 == (char *)0x0) {
          std::ios::clear(iVar5 + (int)(pLVar17->super_ostream)._vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(local_558);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pLVar17,pcVar15,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pLVar17," to ",4);
        if (__s == (long *)0x0) {
          std::ios::clear(iVar5 + (int)(pLVar17->super_ostream)._vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen((char *)__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pLVar17,(char *)__s,sVar6);
        }
        pcVar15 = local_530;
        if (bVar4 != false) {
          LogMessage::~LogMessage((LogMessage *)local_3e8);
        }
      }
    }
    else {
      fprintf(_stderr,"Trying to send TITLE: %s BODY: %s to %s\n",local_530,local_558,local_348);
    }
    local_4c0 = 0;
    local_4b8 = 0;
    local_4c8 = &local_4b8;
    if (fLS::FLAGS_logmailer_buf_abi_cxx11_._8_8_ == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_4c8,0,(char *)0x0,0x12cc2b);
    }
    else {
      ShellEscape((string *)local_448,(string *)fLS::FLAGS_logmailer_buf_abi_cxx11_);
      this = (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_448;
      std::__cxx11::string::operator=((string *)&local_4c8,(string *)this);
      if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
        operator_delete((void *)local_448._0_8_,(ulong)(local_448._16_8_ + 1));
      }
    }
    paVar2 = &local_550.field_2;
    local_550._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_550,local_4c8,local_4c8 + local_4c0);
    std::__cxx11::string::append((char *)&local_550);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,pcVar15,&local_579);
    ShellEscape(&local_4e8,&local_368);
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._M_dataplus._M_p != paVar2) {
      uVar14 = local_550.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_4e8._M_string_length + local_550._M_string_length) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        uVar14 = local_4e8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_4e8._M_string_length + local_550._M_string_length)
      goto LAB_001162ff;
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_4e8,0,(char *)0x0,(ulong)local_550._M_dataplus._M_p)
      ;
    }
    else {
LAB_001162ff:
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_550,(ulong)local_4e8._M_dataplus._M_p);
    }
    local_4a8._0_8_ = local_498;
    pLVar1 = (LogMessageData *)(plVar8 + 2);
    if ((LogMessageData *)*plVar8 == pLVar1) {
      local_498._0_4_ = pLVar1->preserved_errno_;
      local_498[4] = pLVar1->message_text_[0];
      local_498[5] = pLVar1->message_text_[1];
      local_498[6] = pLVar1->message_text_[2];
      local_498[7] = pLVar1->message_text_[3];
      local_498._8_8_ = plVar8[3];
    }
    else {
      local_498._0_4_ = pLVar1->preserved_errno_;
      local_498[4] = pLVar1->message_text_[0];
      local_498[5] = pLVar1->message_text_[1];
      local_498[6] = pLVar1->message_text_[2];
      local_498[7] = pLVar1->message_text_[3];
      local_4a8._0_8_ = (LogMessageData *)*plVar8;
    }
    local_4a8._8_8_ = plVar8[1];
    *plVar8 = (long)pLVar1;
    plVar8[1] = 0;
    *(undefined1 *)&pLVar1->preserved_errno_ = 0;
    plVar8 = (long *)std::__cxx11::string::append(local_4a8);
    puVar3 = (ulong *)(local_448 + 0x10);
    puVar11 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar11) {
      local_448._16_8_ = *puVar11;
      local_448._24_8_ = plVar8[3];
      local_448._0_8_ = puVar3;
    }
    else {
      local_448._16_8_ = *puVar11;
      local_448._0_8_ = (ulong *)*plVar8;
    }
    local_448._8_8_ = plVar8[1];
    *plVar8 = (long)puVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,(char *)__s,&local_57a);
    ShellEscape(&local_508,&local_388);
    peVar13 = (element_type *)0xf;
    if ((ulong *)local_448._0_8_ != puVar3) {
      peVar13 = (element_type *)local_448._16_8_;
    }
    if (peVar13 < (element_type *)((char *)(local_448._8_8_ + 4) + (local_508._M_string_length - 4))
       ) {
      uVar14 = (element_type *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_dataplus._M_p != &local_508.field_2) {
        uVar14 = local_508.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 <
          (element_type *)((char *)(local_448._8_8_ + 4) + (local_508._M_string_length - 4)))
      goto LAB_0011645a;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_508,0,(char *)0x0,local_448._0_8_);
    }
    else {
LAB_0011645a:
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append(local_448,(ulong)local_508._M_dataplus._M_p);
    }
    local_528 = &local_518;
    plVar8 = puVar9 + 2;
    if ((long *)*puVar9 == plVar8) {
      local_518 = *plVar8;
      uStack_510 = puVar9[3];
    }
    else {
      local_518 = *plVar8;
      local_528 = (long *)*puVar9;
    }
    local_520 = puVar9[1];
    *puVar9 = plVar8;
    puVar9[1] = 0;
    *(undefined1 *)plVar8 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,
                      (ulong)(local_508.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((ulong *)local_448._0_8_ != puVar3) {
      operator_delete((void *)local_448._0_8_,(ulong)(local_448._16_8_ + 1));
    }
    pcVar15 = local_558;
    if ((LogMessageData *)local_4a8._0_8_ != (LogMessageData *)local_498) {
      operator_delete((void *)local_4a8._0_8_,local_498._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
      operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._M_dataplus._M_p != paVar2) {
      operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
    }
    if (use_logging) {
      if (SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level ==
          (int32 *)0x0) {
        bVar4 = InitVLOG3__(&SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__,
                            &fLI::FLAGS_v,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                            ,4);
      }
      else {
        bVar4 = 3 < *SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level;
      }
      this = (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(ulong)bVar4;
      if (bVar4 != false) {
        LogMessage::LogMessage
                  ((LogMessage *)local_448,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                   ,0x8b1);
        pLVar17 = (LogStream *)(local_448._8_8_ + 0x7538);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pLVar17,"Mailing command: ",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pLVar17,(char *)local_528,local_520);
        pcVar15 = local_558;
        if (bVar4 != false) {
          LogMessage::~LogMessage((LogMessage *)local_448);
        }
      }
    }
    __s_00 = popen((char *)local_528,"w");
    bVar4 = __s_00 == (FILE *)0x0;
    if (bVar4) {
      if (use_logging) {
        LogMessage::LogMessage
                  ((LogMessage *)local_4a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                   ,0x8c7,ERROR);
        this = (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(local_4a8._8_8_ + 0x7538);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,"Unable to send mail to ",0x17);
        if (__s == (long *)0x0) {
          std::ios::clear((int)this +
                          (int)(((LogStream *)this)->super_ostream)._vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen((char *)__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)__s,sVar6);
        }
        LogMessage::~LogMessage((LogMessage *)local_4a8);
      }
      else {
        fprintf(_stderr,"Unable to send mail to %s\n",__s);
      }
      bVar20 = (byte)this;
    }
    else {
      if (pcVar15 != (char *)0x0) {
        sVar6 = strlen(pcVar15);
        fwrite(pcVar15,1,sVar6,__s_00);
      }
      iVar5 = pclose(__s_00);
      bVar20 = iVar5 != -1;
      if (!(bool)bVar20) {
        if (use_logging) {
          LogMessage::LogMessage
                    ((LogMessage *)local_4a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                     ,0x8bd,ERROR);
          pLVar17 = (LogStream *)(local_4a8._8_8_ + 0x7538);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pLVar17,"Problems sending mail to ",0x19);
          if (__s == (long *)0x0) {
            std::ios::clear((int)pLVar17 + (int)(pLVar17->super_ostream)._vptr_basic_ostream[-3]);
          }
          else {
            sVar6 = strlen((char *)__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)pLVar17,(char *)__s,sVar6)
            ;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pLVar17,": ",2);
          puVar10 = (uint *)__errno_location();
          StrError_abi_cxx11_(&local_550,(google *)(ulong)*puVar10,err);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pLVar17,local_550._M_dataplus._M_p,local_550._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_550._M_dataplus._M_p != paVar2) {
            operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
          }
          LogMessage::~LogMessage((LogMessage *)local_4a8);
        }
        else {
          puVar10 = (uint *)__errno_location();
          StrError_abi_cxx11_((string *)local_4a8,(google *)(ulong)*puVar10,err_00);
          SendEmailInternal();
        }
        bVar20 = 0;
      }
    }
    if (local_528 != &local_518) {
      operator_delete(local_528,local_518 + 1);
    }
    if (local_4c8 != &local_4b8) {
      operator_delete(local_4c8,CONCAT71(uStack_4b7,local_4b8) + 1);
    }
    if (local_348 != local_338) {
      operator_delete(local_348,local_338[0] + 1);
    }
LAB_0011686b:
    if (local_578._M_current != &local_568) {
      operator_delete(local_578._M_current,CONCAT71(uStack_567,local_568) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
    std::ios_base::~ios_base(local_2b8);
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
    if (!bVar4) goto LAB_001168d0;
  }
  bVar20 = 0;
LAB_001168d0:
  return (bool)(bVar20 & 1);
}

Assistant:

static bool SendEmailInternal(const char* dest, const char* subject,
                              const char* body, bool use_logging) {
#ifndef GLOG_OS_EMSCRIPTEN
  if (dest && *dest) {
    // Split the comma-separated list of email addresses, validate each one and
    // build a sanitized new comma-separated string without whitespace.
    std::istringstream ss(dest);
    std::ostringstream sanitized_dests;
    std::string s;
    while (std::getline(ss, s, ',')) {
      trim(s);
      if (s.empty()) {
        continue;
      }
      // We validate the provided email addresses using the same regular
      // expression that HTML5 uses[1], except that we require the address to
      // start with an alpha-numeric character. This is because we don't want to
      // allow email addresses that start with a special character, such as a
      // pipe or dash, which could be misunderstood as a command-line flag by
      // certain versions of `mail` that are vulnerable to command injection.[2]
      // [1]
      // https://html.spec.whatwg.org/multipage/input.html#valid-e-mail-address
      // [2] e.g. https://nvd.nist.gov/vuln/detail/CVE-2004-2771
      if (!std::regex_match(
              s,
              std::regex("^[a-zA-Z0-9]"
                         "[a-zA-Z0-9.!#$%&'*+/=?^_`{|}~-]*@[a-zA-Z0-9]"
                         "(?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?(?:\\.[a-zA-Z0-9]"
                         "(?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?)*$"))) {
        if (use_logging) {
          VLOG(1) << "Invalid destination email address:" << s;
        } else {
          fprintf(stderr, "Invalid destination email address: %s\n", s.c_str());
        }
        return false;
      }
      if (!sanitized_dests.str().empty()) {
        sanitized_dests << ",";
      }
      sanitized_dests << s;
    }
    // Avoid dangling reference
    const std::string& tmp = sanitized_dests.str();
    dest = tmp.c_str();

    if (use_logging) {
      VLOG(1) << "Trying to send TITLE:" << subject << " BODY:" << body
              << " to " << dest;
    } else {
      fprintf(stderr, "Trying to send TITLE: %s BODY: %s to %s\n", subject,
              body, dest);
    }

    string logmailer;

    if (FLAGS_logmailer.empty()) {
      // Don't need to shell escape the literal string
      logmailer = "/bin/mail";
    } else {
      logmailer = ShellEscape(FLAGS_logmailer);
    }

    string cmd =
        logmailer + " -s" + ShellEscape(subject) + " " + ShellEscape(dest);
    if (use_logging) {
      VLOG(4) << "Mailing command: " << cmd;
    }

    FILE* pipe = popen(cmd.c_str(), "w");
    if (pipe != nullptr) {
      // Add the body if we have one
      if (body) {
        fwrite(body, sizeof(char), strlen(body), pipe);
      }
      bool ok = pclose(pipe) != -1;
      if (!ok) {
        if (use_logging) {
          LOG(ERROR) << "Problems sending mail to " << dest << ": "
                     << StrError(errno);
        } else {
          fprintf(stderr, "Problems sending mail to %s: %s\n", dest,
                  StrError(errno).c_str());
        }
      }
      return ok;
    } else {
      if (use_logging) {
        LOG(ERROR) << "Unable to send mail to " << dest;
      } else {
        fprintf(stderr, "Unable to send mail to %s\n", dest);
      }
    }
  }
#else
  (void)dest;
  (void)subject;
  (void)body;
  (void)use_logging;
  LOG(WARNING) << "Email support not available; not sending message";
#endif
  return false;
}